

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::parseICC(LodePNGICC *icc,uchar *data,size_t size)

{
  ulong uVar1;
  byte bVar2;
  uchar uVar3;
  uchar uVar4;
  uint uVar5;
  long lVar6;
  float *pfVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t pos;
  ulong uVar15;
  LodePNGICCCurve *pLVar16;
  float fVar17;
  float fVar18;
  
  if (size < 0x84) {
    return 1;
  }
  icc->has_chad = 0;
  icc->trc[2].type = 0;
  icc->trc[1].type = 0;
  icc->has_whitepoint = 0;
  icc->white[0] = 0.0;
  icc->white[1] = 0.0;
  icc->white[2] = 0.0;
  icc->has_chromaticity = 0;
  icc->red[0] = 0.0;
  icc->red[1] = 0.0;
  icc->red[2] = 0.0;
  icc->green[0] = 0.0;
  icc->green[1] = 0.0;
  *(undefined8 *)(icc->green + 2) = 0;
  icc->blue[1] = 0.0;
  icc->blue[2] = 0.0;
  icc->has_trc = 0;
  icc->trc[0].type = 0;
  bVar2 = data[9];
  icc->version_major = (uint)data[8];
  icc->version_minor = (uint)(bVar2 >> 4);
  icc->version_bugfix = bVar2 & 0xf;
  uVar8 = *(uint *)(data + 0x10);
  uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  iVar9 = (uint)(uVar8 == 0x52474220) * 2;
  if (uVar8 == 0x47524159) {
    iVar9 = 1;
  }
  icc->inputspace = iVar9;
  uVar8 = *(uint *)(data + 0x44);
  icc->illuminant[0] =
       (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)
       * 1.5258789e-05;
  uVar8 = *(uint *)(data + 0x48);
  icc->illuminant[1] =
       (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)
       * 1.5258789e-05;
  uVar8 = *(uint *)(data + 0x4c);
  icc->illuminant[2] =
       (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)
       * 1.5258789e-05;
  if (size == 0x84) {
    return 1;
  }
  uVar13 = (ulong)data[0x81] << 0x10 | (ulong)data[0x80] << 0x18;
  uVar3 = data[0x82];
  uVar4 = data[0x83];
  if ((uVar13 == 0 && uVar3 == '\0') && uVar4 == '\0') {
    return 0;
  }
  uVar12 = 0;
  pos = 0x84;
  do {
    if (size < pos + 8) {
      uVar10 = 0;
    }
    else {
      uVar8 = *(uint *)(data + pos + 4);
      uVar10 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                      uVar8 << 0x18);
    }
    uVar1 = pos + 0xc;
    uVar8 = 0;
    if (uVar1 <= size) {
      uVar8 = *(uint *)(data + pos + 8);
      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    }
    if (size <= uVar1) {
      return 1;
    }
    if (uVar8 < 8) {
      return 1;
    }
    if (size <= uVar10) {
      return 1;
    }
    if (size < uVar8 + uVar10) {
      return 1;
    }
    if ((((data[pos] == 'w') && (data[pos + 1] == 't')) && (data[pos + 2] == 'p')) &&
       (data[pos + 3] == 't')) {
      fVar17 = 0.0;
      fVar18 = 0.0;
      if (uVar10 + 0xc <= size) {
        uVar8 = *(uint *)(data + uVar10 + 8);
        fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                             uVar8 << 0x18) * 1.5258789e-05;
      }
      icc->white[0] = fVar18;
      uVar15 = uVar10 + 0x10;
      if (uVar15 <= size) {
        uVar8 = *(uint *)(data + uVar10 + 0xc);
        fVar17 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                             uVar8 << 0x18) * 1.5258789e-05;
      }
      icc->white[1] = fVar17;
      uVar10 = uVar10 + 0x14;
      fVar18 = 0.0;
      if (uVar10 <= size) {
        uVar8 = *(uint *)(data + uVar15);
        fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                             uVar8 << 0x18) * 1.5258789e-05;
      }
      icc->white[2] = fVar18;
      icc->has_whitepoint = 1;
    }
    else {
      if (((data[pos] == 'r') && (data[pos + 1] == 'X')) &&
         ((data[pos + 2] == 'Y' && (data[pos + 3] == 'Z')))) {
        fVar17 = 0.0;
        fVar18 = 0.0;
        if (uVar10 + 0xc <= size) {
          uVar8 = *(uint *)(data + uVar10 + 8);
          fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18) * 1.5258789e-05;
        }
        icc->red[0] = fVar18;
        if (uVar10 + 0x10 <= size) {
          uVar8 = *(uint *)(data + uVar10 + 0xc);
          fVar17 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18) * 1.5258789e-05;
        }
        icc->red[1] = fVar17;
        fVar18 = 0.0;
        if (uVar10 + 0x14 <= size) {
          uVar8 = *(uint *)(data + uVar10 + 0x10);
          fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18) * 1.5258789e-05;
        }
        icc->red[2] = fVar18;
      }
      else if (((data[pos] == 'g') && (data[pos + 1] == 'X')) &&
              ((data[pos + 2] == 'Y' && (data[pos + 3] == 'Z')))) {
        fVar17 = 0.0;
        fVar18 = 0.0;
        if (uVar10 + 0xc <= size) {
          uVar8 = *(uint *)(data + uVar10 + 8);
          fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18) * 1.5258789e-05;
        }
        icc->green[0] = fVar18;
        if (uVar10 + 0x10 <= size) {
          uVar8 = *(uint *)(data + uVar10 + 0xc);
          fVar17 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18) * 1.5258789e-05;
        }
        icc->green[1] = fVar17;
        fVar18 = 0.0;
        if (uVar10 + 0x14 <= size) {
          uVar8 = *(uint *)(data + uVar10 + 0x10);
          fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18) * 1.5258789e-05;
        }
        icc->green[2] = fVar18;
      }
      else {
        if ((((data[pos] != 'b') || (data[pos + 1] != 'X')) || (data[pos + 2] != 'Y')) ||
           (data[pos + 3] != 'Z')) {
          uVar8 = isICCword(data,size,pos,"chad");
          if (uVar8 == 0) {
            uVar8 = isICCword(data,size,pos,"rTRC");
            if (((uVar8 != 0) || (uVar8 = isICCword(data,size,pos,"gTRC"), uVar8 != 0)) ||
               ((uVar8 = isICCword(data,size,pos,"bTRC"), uVar8 != 0 ||
                (uVar8 = isICCword(data,size,pos,"kTRC"), uVar8 != 0)))) {
              uVar15 = (ulong)(data[pos] == 'g');
              if (data[pos] == 'b') {
                uVar15 = 2;
              }
              uVar8 = isICCword(data,size,uVar10,"curv");
              if (uVar8 != 0) {
                icc->has_trc = 1;
                uVar14 = uVar10 + 0xc;
                uVar8 = 0;
                if (uVar14 <= size) {
                  uVar8 = *(uint *)(data + uVar10 + 8);
                  uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                          uVar8 << 0x18;
                }
                pLVar16 = icc->trc + uVar15;
                if (uVar8 == 1) {
                  pLVar16->type = 2;
                  fVar18 = 0.0;
                  if (uVar10 + 0xe <= size) {
                    fVar18 = (float)(ushort)(*(ushort *)(data + uVar14) << 8 |
                                            *(ushort *)(data + uVar14) >> 8) * 0.00390625;
                  }
                  pLVar16->gamma = fVar18;
                  uVar10 = uVar10 + 0xe;
                }
                else {
                  uVar10 = uVar14;
                  if (uVar8 == 0) {
                    pLVar16->type = 0;
                  }
                  else {
                    uVar11 = (ulong)uVar8;
                    pLVar16->type = 1;
                    if (0x1000000 < uVar8) {
                      return 1;
                    }
                    if (size < uVar14 + uVar11 * 2) {
                      return 1;
                    }
                    pLVar16->lut_size = uVar11;
                    pfVar7 = (float *)malloc(uVar11 * 4);
                    pLVar16->lut = pfVar7;
                    if (uVar11 != 0) {
                      lVar6 = 0;
                      do {
                        uVar10 = uVar14 + 2;
                        fVar18 = 0.0;
                        if (uVar10 <= size) {
                          fVar18 = (float)(ushort)(*(ushort *)(data + uVar14) << 8 |
                                                  *(ushort *)(data + uVar14) >> 8) * 1.5259022e-05;
                        }
                        *(float *)((long)pfVar7 + lVar6) = fVar18;
                        lVar6 = lVar6 + 4;
                        uVar14 = uVar10;
                      } while (uVar11 * 4 - lVar6 != 0);
                    }
                  }
                }
              }
              uVar8 = isICCword(data,size,uVar10,"para");
              if (uVar8 != 0) {
                icc->has_trc = 1;
                uVar8 = 0;
                if (uVar10 + 10 <= size) {
                  uVar8 = (uint)(ushort)(*(ushort *)(data + uVar10 + 8) << 8 |
                                        *(ushort *)(data + uVar10 + 8) >> 8);
                }
                if (4 < uVar8) {
                  return 1;
                }
                pLVar16 = icc->trc + uVar15;
                pLVar16->type = uVar8 + 2;
                uVar15 = uVar10 + 0x10;
                fVar18 = 0.0;
                if (uVar15 <= size) {
                  uVar5 = *(uint *)(data + uVar10 + 0xc);
                  fVar18 = (float)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                        (uVar5 & 0xff00) << 8 | uVar5 << 0x18) * 1.5258789e-05;
                }
                pLVar16->gamma = fVar18;
                if (uVar8 != 0) {
                  fVar17 = 0.0;
                  fVar18 = 0.0;
                  if (uVar10 + 0x14 <= size) {
                    uVar5 = *(uint *)(data + uVar15);
                    fVar18 = (float)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                          (uVar5 & 0xff00) << 8 | uVar5 << 0x18) * 1.5258789e-05;
                  }
                  pLVar16->a = fVar18;
                  if (uVar10 + 0x18 <= size) {
                    uVar5 = *(uint *)(data + uVar10 + 0x14);
                    fVar17 = (float)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                          (uVar5 & 0xff00) << 8 | uVar5 << 0x18) * 1.5258789e-05;
                  }
                  pLVar16->b = fVar17;
                  uVar15 = uVar10 + 0x18;
                }
                uVar10 = uVar15;
                if (1 < uVar8) {
                  fVar18 = 0.0;
                  if (uVar10 + 4 <= size) {
                    uVar5 = *(uint *)(data + uVar10);
                    fVar18 = (float)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                          (uVar5 & 0xff00) << 8 | uVar5 << 0x18) * 1.5258789e-05;
                  }
                  pLVar16->c = fVar18;
                  uVar10 = uVar10 + 4;
                }
                if (2 < uVar8) {
                  fVar18 = 0.0;
                  if (uVar10 + 4 <= size) {
                    uVar5 = *(uint *)(data + uVar10);
                    fVar18 = (float)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                          (uVar5 & 0xff00) << 8 | uVar5 << 0x18) * 1.5258789e-05;
                  }
                  pLVar16->d = fVar18;
                  uVar10 = uVar10 + 4;
                }
                if (uVar8 == 4) {
                  uVar15 = uVar10 + 4;
                  fVar17 = 0.0;
                  fVar18 = 0.0;
                  if (uVar15 <= size) {
                    uVar8 = *(uint *)(data + uVar10);
                    fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                          (uVar8 & 0xff00) << 8 | uVar8 << 0x18) * 1.5258789e-05;
                  }
                  pLVar16->e = fVar18;
                  uVar10 = uVar10 + 8;
                  if (uVar10 <= size) {
                    uVar8 = *(uint *)(data + uVar15);
                    fVar17 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                          (uVar8 & 0xff00) << 8 | uVar8 << 0x18) * 1.5258789e-05;
                  }
                  pLVar16->f = fVar17;
                }
              }
            }
          }
          else {
            lVar6 = 9;
            pfVar7 = icc->chad;
            uVar15 = uVar10 + 8;
            do {
              uVar10 = uVar15 + 4;
              fVar18 = 0.0;
              if (uVar10 <= size) {
                uVar8 = *(uint *)(data + uVar15);
                fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                      (uVar8 & 0xff00) << 8 | uVar8 << 0x18) * 1.5258789e-05;
              }
              *pfVar7 = fVar18;
              pfVar7 = pfVar7 + 1;
              lVar6 = lVar6 + -1;
              uVar15 = uVar10;
            } while (lVar6 != 0);
            icc->has_chad = 1;
          }
          goto LAB_0011cb01;
        }
        fVar17 = 0.0;
        fVar18 = 0.0;
        if (uVar10 + 0xc <= size) {
          uVar8 = *(uint *)(data + uVar10 + 8);
          fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18) * 1.5258789e-05;
        }
        icc->blue[0] = fVar18;
        if (uVar10 + 0x10 <= size) {
          uVar8 = *(uint *)(data + uVar10 + 0xc);
          fVar17 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18) * 1.5258789e-05;
        }
        icc->blue[1] = fVar17;
        fVar18 = 0.0;
        if (uVar10 + 0x14 <= size) {
          uVar8 = *(uint *)(data + uVar10 + 0x10);
          fVar18 = (float)(int)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18) * 1.5258789e-05;
        }
        icc->blue[2] = fVar18;
      }
      uVar10 = uVar10 + 0x14;
      icc->has_chromaticity = 1;
    }
LAB_0011cb01:
    if (size < uVar10) {
      return 1;
    }
    uVar12 = uVar12 + 1;
    pos = uVar1;
    if (uVar12 == (uVar13 | CONCAT11(uVar3,uVar4))) {
      return 0;
    }
  } while( true );
}

Assistant:

static unsigned parseICC(LodePNGICC* icc, const unsigned char* data, size_t size) {
  size_t i, j;
  size_t pos = 0;
  unsigned version;
  unsigned inputspace;
  size_t numtags;

  if(size < 132) return 1; /* Too small to be a valid icc profile. */

  icc->has_chromaticity = 0;
  icc->has_whitepoint = 0;
  icc->has_trc = 0;
  icc->has_chad = 0;

  icc->trc[0].type = icc->trc[1].type = icc->trc[2].type = 0;
  icc->white[0] = icc->white[1] = icc->white[2] = 0;
  icc->red[0] = icc->red[1] = icc->red[2] = 0;
  icc->green[0] = icc->green[1] = icc->green[2] = 0;
  icc->blue[0] = icc->blue[1] = icc->blue[2] = 0;

  pos = 8;
  version = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  icc->version_major = (int)((version >> 24) & 255);
  icc->version_minor = (int)((version >> 20) & 15);
  icc->version_bugfix = (int)((version >> 16) & 15);

  pos = 16;
  inputspace = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  if(inputspace == 0x47524159) {
    /* The string  "GRAY" as unsigned 32-bit int. */
    icc->inputspace = 1;
  } else if(inputspace == 0x52474220) {
    /* The string  "RGB " as unsigned 32-bit int. */
    icc->inputspace = 2;
  } else {
    /* unsupported by PNG (CMYK, YCbCr, Lab, HSV, ...) */
    icc->inputspace = 0;
  }

  /* Should always be 0.9642, 1.0, 0.8249 */
  pos = 68;
  icc->illuminant[0] = decodeICC15Fixed16(data, size, &pos);
  icc->illuminant[1] = decodeICC15Fixed16(data, size, &pos);
  icc->illuminant[2] = decodeICC15Fixed16(data, size, &pos);

  pos = 128;
  numtags = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  /* scan for tags we want to handle */
  for(i = 0; i < numtags; i++) {
    size_t offset;
    unsigned tagsize;
    size_t namepos = pos;
    pos += 4;
    offset = decodeICCUint32(data, size, &pos);
    tagsize = decodeICCUint32(data, size, &pos);
    if(pos >= size || offset >= size) return 1;
    if(offset + tagsize > size) return 1;
    if(tagsize < 8) return 1;

    if(isICCword(data, size, namepos, "wtpt")) {
      offset += 8; /* skip tag and reserved */
      icc->white[0] = decodeICC15Fixed16(data, size, &offset);
      icc->white[1] = decodeICC15Fixed16(data, size, &offset);
      icc->white[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_whitepoint = 1;
    } else if(isICCword(data, size, namepos, "rXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->red[0] = decodeICC15Fixed16(data, size, &offset);
      icc->red[1] = decodeICC15Fixed16(data, size, &offset);
      icc->red[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "gXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->green[0] = decodeICC15Fixed16(data, size, &offset);
      icc->green[1] = decodeICC15Fixed16(data, size, &offset);
      icc->green[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "bXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->blue[0] = decodeICC15Fixed16(data, size, &offset);
      icc->blue[1] = decodeICC15Fixed16(data, size, &offset);
      icc->blue[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "chad")) {
      offset += 8; /* skip datatype keyword "sf32" and reserved */
      for(j = 0; j < 9; j++) {
        icc->chad[j] = decodeICC15Fixed16(data, size, &offset);
      }
      icc->has_chad = 1;
    } else if(isICCword(data, size, namepos, "rTRC") ||
              isICCword(data, size, namepos, "gTRC") ||
              isICCword(data, size, namepos, "bTRC") ||
              isICCword(data, size, namepos, "kTRC")) {
      char c = (char)data[namepos];
      /* both 'k' and 'r' are stored in channel 0 */
      int channel = (c == 'b') ? 2 : (c == 'g' ? 1 : 0);
      /* "curv": linear, gamma power or LUT */
      if(isICCword(data, size, offset, "curv")) {
        size_t count;
        LodePNGICCCurve* trc = &icc->trc[channel];
        icc->has_trc = 1;
        offset += 8; /* skip tag "curv" and reserved */
        count = decodeICCUint32(data, size, &offset);
        if(count == 0) {
          trc->type = 0; /* linear */
        } else if(count == 1) {
          trc->type = 2; /* gamma */
          trc->gamma = decodeICCUint16(data, size, &offset) / 256.0f;
        } else {
          trc->type = 1; /* LUT */
          if(offset + count * 2 > size || count > 16777216) return 1; /* also avoid crazy count */
          trc->lut_size = count;
          trc->lut = (float*)lodepng_malloc(count * sizeof(float));
          for(j = 0; j < count; j++) {
            trc->lut[j] = decodeICCUint16(data, size, &offset) * (1.0f / 65535.0f);
          }
        }
      }
      /* "para": parametric formula with gamma power, multipliers, biases and comparison point */
      /* TODO: test this on a realistic sample */
      if(isICCword(data, size, offset, "para")) {
        unsigned type;
        LodePNGICCCurve* trc = &icc->trc[channel];
        icc->has_trc = 1;
        offset += 8; /* skip tag "para" and reserved */
        type = decodeICCUint16(data, size, &offset);
        offset += 2;
        if(type > 4) return 1; /* unknown parametric curve type */
        trc->type = type + 2;
        trc->gamma = decodeICC15Fixed16(data, size, &offset);
        if(type >= 1) {
          trc->a = decodeICC15Fixed16(data, size, &offset);
          trc->b = decodeICC15Fixed16(data, size, &offset);
        }
        if(type >= 2) {
          trc->c = decodeICC15Fixed16(data, size, &offset);
        }
        if(type >= 3) {
          trc->d = decodeICC15Fixed16(data, size, &offset);
        }
        if(type == 4) {
          trc->e = decodeICC15Fixed16(data, size, &offset);
          trc->f = decodeICC15Fixed16(data, size, &offset);
        }
      }
      /* TODO: verify: does the "chrm" tag participate in computation so should be parsed? */
    }
    /* Return error if any parse went beyond the filesize. Note that the
    parsing itself was always safe since it bound-checks inside. */
    if(offset > size) return 1;
  }

  return 0;
}